

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLinfo.c
# Opt level: O0

void RDL_deleteURFInfo(RDL_URFinfo *uInfo)

{
  uint local_14;
  uint i;
  RDL_URFinfo *uInfo_local;
  
  for (local_14 = 0; local_14 < uInfo->nofWeights; local_14 = local_14 + 1) {
    free(*uInfo->URFrel[local_14]);
    free(uInfo->URFrel[local_14]);
  }
  free(uInfo->URFrel);
  free(uInfo->nofProtos);
  for (local_14 = 0; local_14 < uInfo->nofURFs; local_14 = local_14 + 1) {
    free(uInfo->URFs[local_14]);
  }
  free(uInfo->URFs);
  free(uInfo->nofCFsPerURF);
  free(uInfo);
  return;
}

Assistant:

void RDL_deleteURFInfo(RDL_URFinfo *uInfo)
{
  unsigned i;
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    free(uInfo->URFrel[i][0]);
    free(uInfo->URFrel[i]);
  }
  free(uInfo->URFrel);
  free(uInfo->nofProtos);
  for(i=0; i<uInfo->nofURFs; ++i)
  {
    free(uInfo->URFs[i]);
  }
  free(uInfo->URFs);
  free(uInfo->nofCFsPerURF);
  free(uInfo);
}